

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# appender.cpp
# Opt level: O1

void __thiscall
duckdb::BaseAppender::AppendDecimalValueInternal<duckdb::dtime_t,long>
          (BaseAppender *this,Vector *col,dtime_t input)

{
  NotImplementedException *this_00;
  InternalException *this_01;
  size_type __dnew;
  string local_48;
  size_type local_28;
  
  if (this->appender_type == PHYSICAL) {
    AppendValueInternal<duckdb::dtime_t,long>(this,col,input);
    return;
  }
  if (this->appender_type == LOGICAL) {
    DecimalType::GetWidth(&col->type);
    DecimalType::GetScale(&col->type);
    this_00 = (NotImplementedException *)__cxa_allocate_exception(0x10);
    local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
    local_28 = 0x28;
    local_48._M_dataplus._M_p =
         (pointer)::std::__cxx11::string::_M_create((ulong *)&local_48,(ulong)&local_28);
    local_48.field_2._M_allocated_capacity = local_28;
    builtin_strncpy(local_48._M_dataplus._M_p,"Unimplemented type for TryCastToDecimal!",0x28);
    local_48._M_string_length = local_28;
    local_48._M_dataplus._M_p[local_28] = '\0';
    NotImplementedException::NotImplementedException(this_00,&local_48);
    __cxa_throw(this_00,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
  }
  this_01 = (InternalException *)__cxa_allocate_exception(0x10);
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_48,"Type not implemented for AppenderType","");
  InternalException::InternalException(this_01,&local_48);
  __cxa_throw(this_01,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

void BaseAppender::AppendDecimalValueInternal(Vector &col, SRC input) {
	switch (appender_type) {
	case AppenderType::LOGICAL: {
		auto &type = col.GetType();
		D_ASSERT(type.id() == LogicalTypeId::DECIMAL);
		auto width = DecimalType::GetWidth(type);
		auto scale = DecimalType::GetScale(type);
		CastParameters parameters;
		auto &result = FlatVector::GetData<DST>(col)[chunk.size()];
		TryCastToDecimal::Operation<SRC, DST>(input, result, parameters, width, scale);
		return;
	}
	case AppenderType::PHYSICAL: {
		AppendValueInternal<SRC, DST>(col, input);
		return;
	}
	default:
		throw InternalException("Type not implemented for AppenderType");
	}
}